

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationVP.cpp
# Opt level: O1

bool __thiscall DIS::SeparationVP::operator==(SeparationVP *this,SeparationVP *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  bool bVar9;
  
  uVar1 = rhs->_recordType;
  uVar2 = this->_recordType;
  uVar3 = rhs->_reasonForSeparation;
  uVar4 = this->_reasonForSeparation;
  uVar5 = rhs->_preEntityIndicator;
  uVar6 = this->_preEntityIndicator;
  uVar7 = rhs->_padding1;
  uVar8 = this->_padding1;
  bVar9 = EntityID::operator==(&this->_parentEntityID,&rhs->_parentEntityID);
  return (((bVar9 && this->_padding2 == rhs->_padding2) &&
          this->_stationLocation == rhs->_stationLocation) && (uVar8 == uVar7 && uVar6 == uVar5)) &&
         (uVar4 == uVar3 && uVar2 == uVar1);
}

Assistant:

bool SeparationVP::operator ==(const SeparationVP& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_reasonForSeparation == rhs._reasonForSeparation) ) ivarsEqual = false;
     if( ! (_preEntityIndicator == rhs._preEntityIndicator) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_parentEntityID == rhs._parentEntityID) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;
     if( ! (_stationLocation == rhs._stationLocation) ) ivarsEqual = false;

    return ivarsEqual;
 }